

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void vdbeSorterExtendFile(sqlite3 *db,sqlite3_file *pFd,i64 nByte)

{
  long in_FS_OFFSET;
  int chunksize;
  void *p;
  undefined4 local_2c;
  void *local_28;
  i64 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = nByte;
  if ((nByte <= db->nMaxSorterMmap) && (2 < pFd->pMethods->iVersion)) {
    local_28 = (void *)0x0;
    local_2c = 0x1000;
    (*pFd->pMethods->xFileControl)(pFd,6,&local_2c);
    if (pFd->pMethods != (sqlite3_io_methods *)0x0) {
      (*pFd->pMethods->xFileControl)(pFd,5,&local_20);
    }
    (*pFd->pMethods->xFetch)(pFd,0,(int)local_20,&local_28);
    if (local_28 != (void *)0x0) {
      (*pFd->pMethods->xUnfetch)(pFd,0,local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void vdbeSorterExtendFile(sqlite3 *db, sqlite3_file *pFd, i64 nByte){
  if( nByte<=(i64)(db->nMaxSorterMmap) && pFd->pMethods->iVersion>=3 ){
    void *p = 0;
    int chunksize = 4*1024;
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_CHUNK_SIZE, &chunksize);
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_SIZE_HINT, &nByte);
    sqlite3OsFetch(pFd, 0, (int)nByte, &p);
    if( p ) sqlite3OsUnfetch(pFd, 0, p);
  }
}